

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O0

void __thiscall Ptex::v2_2::PtexSeparableKernel::upresV(PtexSeparableKernel *this)

{
  float fVar1;
  float *pfVar2;
  int i;
  float *dst;
  float *src;
  PtexSeparableKernel *this_local;
  
  src = this->kv + this->vw;
  pfVar2 = this->kv + (this->vw << 1);
  for (i = this->vw; src = src + -1, dst = pfVar2 + -2, 0 < i; i = i + -1) {
    fVar1 = *src;
    pfVar2[-1] = fVar1 / 2.0;
    *dst = fVar1 / 2.0;
    pfVar2 = dst;
  }
  this->vw = this->vw << 1;
  this->v = this->v << 1;
  (this->res).vlog2 = (this->res).vlog2 + '\x01';
  return;
}

Assistant:

void upresV()
    {
        float* src = kv + vw-1;
        float* dst = kv + vw*2-2;
        for (int i = vw; i > 0; i--) {
            dst[0] = dst[1] = *src-- / 2;
            dst -=2;
        }
        vw *= 2;
        v *= 2;
        res.vlog2++;
    }